

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ReaderMgr.cpp
# Opt level: O0

XMLReader * __thiscall
xercesc_4_0::ReaderMgr::createReader
          (ReaderMgr *this,XMLCh *baseURI,XMLCh *sysId,XMLCh *pubId,bool xmlDecl,RefFrom refFrom,
          Types type,Sources source,InputSource **srcToFill,bool calcSrcOfs,XMLSize_t lowWaterMark,
          bool disableDefaultEntityResolution)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  XMLCh *pXVar4;
  undefined4 extraout_var;
  InputSource *this_00;
  MalformedURLException *pMVar5;
  URLInputSource *this_01;
  XMLReader *retVal;
  Janitor<xercesc_4_0::InputSource> janSrc;
  XMLBuffer resolvedSysId;
  XMLURL urlTmp;
  XMLCh *baseuri;
  LastExtEntityInfo lastInfo;
  undefined1 local_100 [8];
  XMLResourceIdentifier resourceIdentifier;
  XMLBuffer expSysId;
  XMLCh *normalizedURI;
  XMLCh local_7a;
  undefined1 local_78 [8];
  XMLBuffer normalizedSysId;
  bool disableDefaultEntityResolution_local;
  bool calcSrcOfs_local;
  RefFrom refFrom_local;
  bool xmlDecl_local;
  XMLCh *pubId_local;
  XMLCh *sysId_local;
  XMLCh *baseURI_local;
  ReaderMgr *this_local;
  
  normalizedSysId.fBuffer._7_1_ = calcSrcOfs;
  normalizedSysId.fBuffer._6_1_ = disableDefaultEntityResolution;
  XMLBuffer::XMLBuffer((XMLBuffer *)local_78,0x3ff,this->fMemoryManager);
  local_7a = L'\xffff';
  XMLString::removeChar(sysId,&local_7a,(XMLBuffer *)local_78);
  pXVar4 = XMLBuffer::getRawBuffer((XMLBuffer *)local_78);
  XMLBuffer::XMLBuffer((XMLBuffer *)&resourceIdentifier.fLocator,0x3ff,this->fMemoryManager);
  if (this->fEntityHandler == (XMLEntityHandler *)0x0) {
    XMLBuffer::set((XMLBuffer *)&resourceIdentifier.fLocator,pXVar4);
  }
  else {
    uVar2 = (*this->fEntityHandler->_vptr_XMLEntityHandler[3])
                      (this->fEntityHandler,pXVar4,&resourceIdentifier.fLocator);
    if ((uVar2 & 1) == 0) {
      XMLBuffer::set((XMLBuffer *)&resourceIdentifier.fLocator,pXVar4);
    }
  }
  *srcToFill = (InputSource *)0x0;
  if (this->fEntityHandler != (XMLEntityHandler *)0x0) {
    pXVar4 = XMLBuffer::getRawBuffer((XMLBuffer *)&resourceIdentifier.fLocator);
    XMLResourceIdentifier::XMLResourceIdentifier
              ((XMLResourceIdentifier *)local_100,ExternalEntity,pXVar4,L"",pubId,baseURI,
               &this->super_Locator);
    iVar3 = (*this->fEntityHandler->_vptr_XMLEntityHandler[5])(this->fEntityHandler,local_100);
    *srcToFill = (InputSource *)CONCAT44(extraout_var,iVar3);
    XMLResourceIdentifier::~XMLResourceIdentifier((XMLResourceIdentifier *)local_100);
  }
  if (*srcToFill == (InputSource *)0x0) {
    if ((normalizedSysId.fBuffer._6_1_ & 1) != 0) {
      this_local = (ReaderMgr *)0x0;
      lastInfo.colNumber._4_4_ = 1;
      goto LAB_00364c5f;
    }
    LastExtEntityInfo::LastExtEntityInfo((LastExtEntityInfo *)&baseuri);
    if ((baseURI == (XMLCh *)0x0) || (urlTmp._80_8_ = baseURI, *baseURI == L'\0')) {
      getLastExtEntityInfo(this,(LastExtEntityInfo *)&baseuri);
      urlTmp._80_8_ = baseuri;
    }
    XMLURL::XMLURL((XMLURL *)&resolvedSysId.fBuffer,this->fMemoryManager);
    pXVar4 = XMLBuffer::getRawBuffer((XMLBuffer *)&resourceIdentifier.fLocator);
    bVar1 = XMLURL::setURL((XMLURL *)&resolvedSysId.fBuffer,(XMLCh *)urlTmp._80_8_,pXVar4,
                           (XMLURL *)&resolvedSysId.fBuffer);
    if ((!bVar1) || (bVar1 = XMLURL::isRelative((XMLURL *)&resolvedSysId.fBuffer), bVar1)) {
      if ((this->fStandardUriConformant & 1U) != 0) {
        pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ReaderMgr.cpp"
                   ,0x2e7,URL_MalformedURL,this->fMemoryManager);
        __cxa_throw(pMVar5,&MalformedURLException::typeinfo,
                    MalformedURLException::~MalformedURLException);
      }
      XMLBuffer::XMLBuffer((XMLBuffer *)&janSrc,0x3ff,this->fMemoryManager);
      pXVar4 = XMLBuffer::getRawBuffer((XMLBuffer *)&resourceIdentifier.fLocator);
      XMLUri::normalizeURI(pXVar4,(XMLBuffer *)&janSrc);
      this_00 = (InputSource *)XMemory::operator_new(0x30,this->fMemoryManager);
      pXVar4 = XMLBuffer::getRawBuffer((XMLBuffer *)&janSrc);
      LocalFileInputSource::LocalFileInputSource
                ((LocalFileInputSource *)this_00,(XMLCh *)urlTmp._80_8_,pXVar4,this->fMemoryManager)
      ;
      *srcToFill = this_00;
      XMLBuffer::~XMLBuffer((XMLBuffer *)&janSrc);
    }
    else {
      if (((this->fStandardUriConformant & 1U) != 0) &&
         (bVar1 = XMLURL::hasInvalidChar((XMLURL *)&resolvedSysId.fBuffer), bVar1)) {
        pMVar5 = (MalformedURLException *)__cxa_allocate_exception(0x30);
        MalformedURLException::MalformedURLException
                  (pMVar5,
                   "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/internal/ReaderMgr.cpp"
                   ,0x2ec,URL_MalformedURL,this->fMemoryManager);
        __cxa_throw(pMVar5,&MalformedURLException::typeinfo,
                    MalformedURLException::~MalformedURLException);
      }
      this_01 = (URLInputSource *)XMemory::operator_new(0x88,this->fMemoryManager);
      URLInputSource::URLInputSource(this_01,(XMLURL *)&resolvedSysId.fBuffer,this->fMemoryManager);
      *srcToFill = (InputSource *)this_01;
    }
    XMLURL::~XMLURL((XMLURL *)&resolvedSysId.fBuffer);
  }
  Janitor<xercesc_4_0::InputSource>::Janitor
            ((Janitor<xercesc_4_0::InputSource> *)&retVal,*srcToFill);
  this_local = (ReaderMgr *)
               createReader(this,*srcToFill,xmlDecl,refFrom,type,source,
                            (bool)(normalizedSysId.fBuffer._7_1_ & 1),lowWaterMark);
  Janitor<xercesc_4_0::InputSource>::orphan((Janitor<xercesc_4_0::InputSource> *)&retVal);
  if ((XMLReader *)this_local == (XMLReader *)0x0) {
    this_local = (ReaderMgr *)0x0;
  }
  else {
    uVar2 = this->fNextReaderNum;
    this->fNextReaderNum = uVar2 + 1;
    XMLReader::setReaderNum((XMLReader *)this_local,(ulong)uVar2);
  }
  lastInfo.colNumber._4_4_ = 1;
  Janitor<xercesc_4_0::InputSource>::~Janitor((Janitor<xercesc_4_0::InputSource> *)&retVal);
LAB_00364c5f:
  XMLBuffer::~XMLBuffer((XMLBuffer *)&resourceIdentifier.fLocator);
  XMLBuffer::~XMLBuffer((XMLBuffer *)local_78);
  return (XMLReader *)this_local;
}

Assistant:

XMLReader* ReaderMgr::createReader( const   XMLCh* const        baseURI
                                    , const XMLCh* const        sysId
                                    , const XMLCh* const        pubId
                                    , const bool                xmlDecl
                                    , const XMLReader::RefFrom  refFrom
                                    , const XMLReader::Types    type
                                    , const XMLReader::Sources  source
                                    ,       InputSource*&       srcToFill
                                    , const bool                calcSrcOfs
                                    ,       XMLSize_t           lowWaterMark
                                    , const bool                disableDefaultEntityResolution)
{
    //Normalize sysId
    XMLBuffer normalizedSysId(1023, fMemoryManager);
    XMLString::removeChar(sysId, 0xFFFF, normalizedSysId);
    const XMLCh* normalizedURI = normalizedSysId.getRawBuffer();

    // Create a buffer for expanding the system id
    XMLBuffer expSysId(1023, fMemoryManager);

    //
    //  Allow the entity handler to expand the system id if they choose
    //  to do so.
    //
    if (fEntityHandler)
    {
        if (!fEntityHandler->expandSystemId(normalizedURI, expSysId))
            expSysId.set(normalizedURI);
    }
     else
    {
        expSysId.set(normalizedURI);
    }

    // Call the entity resolver interface to get an input source
    srcToFill = 0;
    if (fEntityHandler)
    {
        XMLResourceIdentifier resourceIdentifier(XMLResourceIdentifier::ExternalEntity,
                            expSysId.getRawBuffer(), XMLUni::fgZeroLenString, pubId, baseURI,
                            this);
        srcToFill = fEntityHandler->resolveEntity(&resourceIdentifier);
    }

    //
    //  If they didn't create a source via the entity resolver, then we
    //  have to create one on our own.
    //
    if (!srcToFill)
    {
        if (disableDefaultEntityResolution)
            return 0;

        LastExtEntityInfo lastInfo;

        const XMLCh* baseuri=baseURI;
        if(!baseuri || !*baseuri)
        {
            getLastExtEntityInfo(lastInfo);
            baseuri = lastInfo.systemId;
        }

        XMLURL urlTmp(fMemoryManager);
        if ((!urlTmp.setURL(baseuri, expSysId.getRawBuffer(), urlTmp)) ||
            (urlTmp.isRelative()))
        {
            if (!fStandardUriConformant)
            {
                XMLBuffer resolvedSysId(1023, fMemoryManager);
                XMLUri::normalizeURI(expSysId.getRawBuffer(), resolvedSysId);

                srcToFill = new (fMemoryManager) LocalFileInputSource
                (
                    baseuri
                    , resolvedSysId.getRawBuffer()
                    , fMemoryManager
                );
            }
            else
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
        }
        else
        {
            if (fStandardUriConformant && urlTmp.hasInvalidChar())
                ThrowXMLwithMemMgr(MalformedURLException, XMLExcepts::URL_MalformedURL, fMemoryManager);
            srcToFill = new (fMemoryManager) URLInputSource(urlTmp, fMemoryManager);
        }
    }

    // Put a janitor on the input source
    Janitor<InputSource> janSrc(srcToFill);

    //
    //  Now call the other version with the input source that we have, and
    //  return the resulting reader.
    //
    XMLReader* retVal = createReader
    (
        *srcToFill
        , xmlDecl
        , refFrom
        , type
        , source
        , calcSrcOfs
        , lowWaterMark
    );

    // Either way, we can release the input source now
    janSrc.orphan();

    // If it failed for any reason, then return zero.
    if (!retVal)
        return 0;

    // Give this reader the next available reader number and return it
    retVal->setReaderNum(fNextReaderNum++);
    return retVal;
}